

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

void __thiscall Population::add_creature(Population *this,Creature *crt)

{
  Creature *this_00;
  type pCVar1;
  double local_38;
  undefined1 local_30 [8];
  shared_ptr<Creature> nc;
  
  this_00 = (Creature *)operator_new(0x50);
  Creature::Creature(this_00,crt);
  boost::shared_ptr<Creature>::shared_ptr<Creature>((shared_ptr<Creature> *)local_30,this_00);
  std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::push_back
            (&this->creats,(shared_ptr<Creature> *)local_30);
  pCVar1 = boost::shared_ptr<Creature>::operator->((shared_ptr<Creature> *)local_30);
  local_38 = pCVar1->fitness;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->fitdict,&local_38);
  boost::detail::shared_count::~shared_count((shared_count *)&nc);
  return;
}

Assistant:

void Population::add_creature( const Creature& crt )
{
	boost::shared_ptr<Creature> nc(new Creature(crt));
	creats.push_back(nc);

	fitdict.push_back(nc->get_fitness());
}